

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x98c060;
  *(undefined8 *)&this->field_0x178 = 0x98c178;
  *(undefined8 *)&this->field_0x88 = 0x98c088;
  *(undefined8 *)&this->field_0x98 = 0x98c0b0;
  *(undefined8 *)&this->field_0xd0 = 0x98c0d8;
  *(undefined8 *)&this->field_0x100 = 0x98c100;
  *(undefined8 *)&this->field_0x138 = 0x98c128;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x98c150;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0098c198);
  operator_delete(this,400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}